

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VMinLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  double dVar5;
  timespec spec;
  timespec local_30;
  
  N_VConst(0x4000000000000000);
  set_element(X,param_2 + -1,(double)-myid);
  clock_gettime(1,&local_30);
  lVar2 = local_30.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_30.tv_nsec;
  uVar4 = N_VMinLocal(X);
  sync_device(X);
  clock_gettime(1,&local_30);
  lVar3 = local_30.tv_sec - base_time_tv_sec;
  iVar1 = SUNRCompareTol(uVar4,(double)-myid,0x3e50000000000000);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VMinLocal");
      iVar1 = 0;
    }
  }
  else {
    printf(">>> FAILED test -- N_VMinLocal, Proc %d\n",(ulong)(uint)myid);
    iVar1 = 1;
  }
  max_time(X,((double)local_30.tv_nsec / 1000000000.0 + (double)lVar3) -
             (dVar5 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VMinLocal");
  }
  return iVar1;
}

Assistant:

int Test_N_VMinLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, negmyid;

  /* fill vector data */
  negmyid = (sunrealtype)-myid;
  N_VConst(TWO, X);
  set_element(X, local_length - 1, negmyid);

  start_time = get_time();
  ans        = N_VMinLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal negmyid */
  failure = SUNRCompareTol(ans, negmyid, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VMinLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VMinLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VMinLocal", maxt);

  return (fails);
}